

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.h
# Opt level: O0

BLOCK_SIZE get_partition_subsize(BLOCK_SIZE bsize,PARTITION_TYPE partition)

{
  int iVar1;
  byte in_SIL;
  BLOCK_SIZE in_DIL;
  int sqr_bsize_idx;
  BLOCK_SIZE local_1;
  
  if (in_SIL == 0xff) {
    local_1 = BLOCK_INVALID;
  }
  else {
    iVar1 = get_sqr_bsize_idx(in_DIL);
    if (iVar1 < 6) {
      local_1 = subsize_lookup[in_SIL][iVar1];
    }
    else {
      local_1 = BLOCK_INVALID;
    }
  }
  return local_1;
}

Assistant:

static inline BLOCK_SIZE get_partition_subsize(BLOCK_SIZE bsize,
                                               PARTITION_TYPE partition) {
  if (partition == PARTITION_INVALID) {
    return BLOCK_INVALID;
  } else {
    const int sqr_bsize_idx = get_sqr_bsize_idx(bsize);
    return sqr_bsize_idx >= SQR_BLOCK_SIZES
               ? BLOCK_INVALID
               : subsize_lookup[partition][sqr_bsize_idx];
  }
}